

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O1

void CB_ADF::learn_SM(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  label *cs_labels;
  action_scores *this;
  action_scores *this_00;
  float fVar1;
  wclass *pwVar2;
  example *peVar3;
  bool bVar4;
  pointer ppeVar5;
  action_score *paVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float local_d4;
  uint32_t local_c8;
  action_score local_b0;
  action_score *local_a8;
  label *local_a0;
  undefined1 local_98 [16];
  v_array<CB::label> *local_88;
  v_array<COST_SENSITIVE::label> *local_80;
  multi_learner *local_78;
  double local_70;
  action_scores *local_68;
  pointer_____offset_0x10___ *local_60;
  action_score *local_58;
  pointer_____offset_0x10___ *local_50;
  action_score *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  cs_labels = &mydata->cs_labels;
  GEN_CS::gen_cs_test_example(examples,cs_labels);
  local_88 = &mydata->cb_labels;
  local_80 = &mydata->prepped_cs_labels;
  local_a0 = cs_labels;
  local_78 = base;
  GEN_CS::call_cs_ldf<false>(base,examples,local_88,cs_labels,local_80,mydata->offset,0);
  this = &mydata->a_s;
  v_array<ACTION_SCORE::action_score>::clear(this);
  this_00 = &mydata->prob_s;
  v_array<ACTION_SCORE::action_score>::clear(this_00);
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (((*ppeVar5)->pred).scalars._end != ((*ppeVar5)->pred).scalars._begin) {
    uVar9 = 1;
    uVar7 = 0;
    do {
      local_b0.score = ((*ppeVar5)->pred).a_s._begin[uVar7].score;
      local_b0.action = (uint32_t)((*ppeVar5)->pred).scalars._begin[uVar7 * 2];
      v_array<ACTION_SCORE::action_score>::push_back(this,&local_b0);
      local_b0.score = 0.0;
      local_b0.action =
           (uint32_t)
           ((*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start)->pred).scalars._begin[uVar7 * 2];
      v_array<ACTION_SCORE::action_score>::push_back(this_00,&local_b0);
      ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar7 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 < (ulong)((long)((*ppeVar5)->pred).scalars._end -
                             (long)((*ppeVar5)->pred).scalars._begin >> 3));
  }
  ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = this_00;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar5) {
    fVar12 = 1.0;
    local_c8 = 0;
    local_d4 = 1.0;
  }
  else {
    uVar7 = 0;
    fVar12 = 1.0;
    uVar9 = 1;
    local_d4 = 1.0;
    local_c8 = 0;
    do {
      pwVar2 = (ppeVar5[uVar7]->l).cs.costs._begin;
      bVar4 = true;
      if ((long)(ppeVar5[uVar7]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        fVar1 = pwVar2->x;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          local_98 = ZEXT416((uint)fVar1);
          local_d4 = GEN_CS::safe_probability(pwVar2->partial_prediction);
          local_d4 = (float)local_98._0_4_ / local_d4;
          if (pwVar2->x < 0.0) {
            local_d4 = -local_d4;
          }
          local_c8 = uVar9 - 1;
          uVar11 = -(uint)(pwVar2->x < 0.0);
          fVar12 = (float)(~uVar11 & (uint)fVar12 | uVar11 & 0xbf800000);
          bVar4 = false;
        }
      }
      if (!bVar4) break;
      uVar7 = (ulong)uVar9;
      ppeVar5 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar7 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3));
  }
  GEN_CS::gen_cs_example_sm(examples,local_c8,fVar12,*this,local_a0);
  local_a8 = (mydata->a_s)._begin;
  local_38 = (mydata->a_s)._end;
  local_48 = (mydata->prob_s)._begin;
  local_58 = (mydata->prob_s)._end;
  local_b0 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_60 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>();
  paVar6 = (mydata->prob_s)._begin;
  lVar8 = (long)(mydata->prob_s)._end - (long)paVar6;
  if (lVar8 != 0) {
    uVar9 = 1;
    uVar7 = 0;
    do {
      if (paVar6[uVar7].action == local_c8) {
        local_d4 = local_d4 * paVar6[uVar7].score;
        break;
      }
      uVar7 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 < (ulong)(lVar8 >> 3));
  }
  v_array<unsigned_int>::clear(&mydata->backup_weights);
  local_98._0_8_ = &mydata->backup_nf;
  v_array<unsigned_int>::clear(&mydata->backup_nf);
  paVar6 = (mydata->prob_s)._begin;
  if ((mydata->prob_s)._end != paVar6) {
    local_70 = (double)local_d4;
    uVar7 = 0;
    uVar10 = 1;
    do {
      uVar9 = paVar6[uVar7].action;
      local_b0.action =
           (uint32_t)
           (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar9]->weight;
      v_array<unsigned_int>::push_back(&mydata->backup_weights,&local_b0.action);
      local_b0.action =
           (uint32_t)
           (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar9]->num_features;
      v_array<unsigned_int>::push_back((v_array<unsigned_int> *)local_98._0_8_,&local_b0.action);
      fVar12 = local_68->_begin[uVar7].score;
      if (uVar9 == local_c8) {
        fVar12 = (float)((1.0 - (double)fVar12) * local_70);
      }
      else {
        fVar12 = fVar12 * local_d4;
      }
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar9]->weight = fVar12;
      peVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      if (peVar3->weight <= 1e-15) {
        peVar3->weight = 0.0;
      }
      paVar6 = (mydata->prob_s)._begin;
      bVar4 = uVar10 < (ulong)((long)(mydata->prob_s)._end - (long)paVar6 >> 3);
      uVar7 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar4);
  }
  GEN_CS::call_cs_ldf<true>(local_78,examples,local_88,local_a0,local_80,mydata->offset,0);
  paVar6 = (mydata->prob_s)._begin;
  if ((mydata->prob_s)._end != paVar6) {
    uVar9 = 1;
    uVar7 = 0;
    do {
      uVar11 = paVar6[uVar7].action;
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar11]->weight =
           (float)(mydata->backup_weights)._begin[uVar7];
      (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar11]->num_features =
           (ulong)(mydata->backup_nf)._begin[uVar7];
      uVar7 = (ulong)uVar9;
      paVar6 = (mydata->prob_s)._begin;
      uVar9 = uVar9 + 1;
    } while (uVar7 < (ulong)((long)(mydata->prob_s)._end - (long)paVar6 >> 3));
  }
  return;
}

Assistant:

void learn_SM(cb_adf& mydata, multi_learner& base, multi_ex& examples) {
  gen_cs_test_example(examples, mydata.cs_labels);  // create test labels.
  call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  // Can probably do this more efficiently than 6 loops over the examples...
  //[1: initialize temporary storage;
  // 2: find chosen action;
  // 3: create cs_labels (gen_cs_example_sm);
  // 4: get probability of chosen action;
  // 5: backup example wts;
  // 6: restore example wts]
  mydata.a_s.clear();
  mydata.prob_s.clear();
  // TODO: Check that predicted scores are always stored with the first example
  for (uint32_t i = 0; i < examples[0]->pred.a_s.size(); i++)
  {
    mydata.a_s.push_back({examples[0]->pred.a_s[i].action, examples[0]->pred.a_s[i].score});
    mydata.prob_s.push_back({examples[0]->pred.a_s[i].action, 0.0});
  }

  float sign_offset = 1.0;    // To account for negative rewards/costs
  uint32_t chosen_action = 0;
  float example_weight = 1.0;

  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      chosen_action = i;
      example_weight = ld.costs[0].cost / safe_probability(ld.costs[0].probability);

      // Importance weights of examples cannot be negative.
      // So we use a trick: set |w| as weight, and use sign(w) as an offset in the regression target.
      if (ld.costs[0].cost < 0.0)
      {
        sign_offset = -1.0;
        example_weight = -example_weight;
      }
      break;
    }
  }

  gen_cs_example_sm(examples, chosen_action, sign_offset, mydata.a_s, mydata.cs_labels);

  // Lambda is -1 in the call to generate_softmax because in vw, lower score is better; for softmax higher score is better.
  generate_softmax(-1.0, begin_scores(mydata.a_s), end_scores(mydata.a_s), begin_scores(mydata.prob_s), end_scores(mydata.prob_s));

  // TODO: Check Marco's example that causes VW to report prob > 1.

  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)  // Scale example_wt by prob of chosen action
  {
    if (mydata.prob_s[i].action == chosen_action)
    {
      example_weight *= mydata.prob_s[i].score;
      break;
    }
  }

  mydata.backup_weights.clear();
  mydata.backup_nf.clear();
    for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    mydata.backup_weights.push_back(examples[current_action]->weight);
    mydata.backup_nf.push_back(examples[current_action]->num_features);

    if (current_action == chosen_action)
      examples[current_action]->weight = example_weight * (1.0 - mydata.prob_s[i].score);
    else
      examples[current_action]->weight = example_weight * mydata.prob_s[i].score;

    if (examples[current_action]->weight <= 1e-15)
      examples[current_action]->weight = 0;
  }

  //Do actual training
  call_cs_ldf<true>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  //Restore example weights and numFeatures
  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    examples[current_action]->weight = mydata.backup_weights[i];
    examples[current_action]->num_features = mydata.backup_nf[i];
  }
}